

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
     *this,int i)

{
  FadExpr<FadFuncCos<Fad<double>_>_> *in_RDI;
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  int in_stack_ffffffffffffffcc;
  
  vVar1 = FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>::dx
                    ((FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)in_RDI,
                     in_stack_ffffffffffffffcc);
  vVar2 = FadExpr<FadFuncCos<Fad<double>_>_>::val((FadExpr<FadFuncCos<Fad<double>_>_> *)0x1f17c97);
  vVar3 = FadExpr<FadFuncCos<Fad<double>_>_>::dx(in_RDI,in_stack_ffffffffffffffcc);
  vVar4 = FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>::val
                    ((FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)0x1f17cc2);
  return vVar1 * vVar2 + vVar3 * vVar4;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}